

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

void __thiscall BasePort::BroadcastReadInfo::PrintTiming(BroadcastReadInfo *this,ostream *outStr)

{
  long lVar1;
  long lVar2;
  char cVar3;
  ostream *poVar4;
  char *pcVar5;
  uint bnum;
  long lVar6;
  uint uVar7;
  BroadcastBoardInfo *pBVar8;
  double dVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>(outStr,"Updates (usec): ",0x10);
  pBVar8 = this->boardInfo;
  lVar6 = 0;
  uVar7 = 0;
  do {
    if (pBVar8->inUse == true) {
      dVar9 = pBVar8->updateTime;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)outStr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 2;
      poVar4 = std::ostream::_M_insert<double>(dVar9 * 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"   ",3);
      uVar7 = uVar7 + 1;
    }
    lVar6 = lVar6 + 1;
    pBVar8 = pBVar8 + 1;
  } while (lVar6 != 0x10);
  dVar9 = (this->updateFinishTime - this->updateStartTime) * 1000000.0;
  std::__ostream_insert<char,std::char_traits<char>>(outStr,"Range: ",7);
  lVar6 = *(long *)outStr;
  lVar1 = *(long *)(lVar6 + -0x18);
  *(uint *)(outStr + lVar1 + 0x18) = *(uint *)(outStr + lVar1 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(outStr + *(long *)(lVar6 + -0x18) + 8) = 2;
  std::ostream::_M_insert<double>(dVar9);
  if (1 < uVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(outStr," (",2);
    poVar4 = std::ostream::_M_insert<double>(dVar9 / (double)(uVar7 - 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  }
  pcVar5 = "   ";
  if (this->updateOverflow != false) {
    pcVar5 = "OVF";
  }
  std::__ostream_insert<char,std::char_traits<char>>(outStr,pcVar5,3);
  cVar3 = (char)outStr;
  std::ios::widen((char)*(undefined8 *)(*(long *)outStr + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(outStr,"Read start: ",0xc);
  lVar6 = *(long *)outStr;
  *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(outStr + *(long *)(lVar6 + -0x18) + 8) = 2;
  *(undefined8 *)(outStr + *(long *)(lVar6 + -0x18) + 0x10) = 6;
  poVar4 = std::ostream::_M_insert<double>(this->readStartTime * 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  finish: ",10);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
  poVar4 = std::ostream::_M_insert<double>(this->readFinishTime * 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  delta: ",9);
  poVar4 = std::ostream::_M_insert<double>((this->readFinishTime - this->readStartTime) * 1000000.0)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  gap: ",7);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
  std::ostream::_M_insert<double>(this->gapTime * 1000000.0);
  if (((this->gapTimeMin != 1.0) || (NAN(this->gapTimeMin))) &&
     ((this->gapTimeMax != 0.0 || (NAN(this->gapTimeMax))))) {
    std::__ostream_insert<char,std::char_traits<char>>(outStr," (min ",6);
    *(undefined8 *)(outStr + *(long *)(*(long *)outStr + -0x18) + 0x10) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->gapTimeMin * 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", max ",6);
    poVar4 = std::ostream::_M_insert<double>(this->gapTimeMax * 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  }
  pcVar5 = "   ";
  if (this->readOverflow != false) {
    pcVar5 = "OVF";
  }
  std::__ostream_insert<char,std::char_traits<char>>(outStr,pcVar5,3);
  std::ios::widen((char)*(undefined8 *)(*(long *)outStr + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void BasePort::BroadcastReadInfo::PrintTiming(std::ostream &outStr) const
{
    unsigned int num_bds = 0;
    outStr << "Updates (usec): ";
    for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
        if (boardInfo[bnum].inUse) {
            double bdTime_us = boardInfo[bnum].updateTime*1e6;
            outStr << bnum << ": " << std::fixed << std::setprecision(2) << bdTime_us
                   << "   ";
            num_bds++;
        }
    }
    double bdTimeDiff_us = (updateFinishTime-updateStartTime)*1e6;
    outStr << "Range: " << std::fixed << std::setprecision(2) << bdTimeDiff_us;
    if (num_bds > 1)
        outStr << " (" << (bdTimeDiff_us/(num_bds-1)) << ") ";
    outStr << (updateOverflow ? "OVF" : "   ");
    outStr << std::endl;
    outStr << "Read start: " << std::fixed << std::setprecision(2) << std::setw(6) << (readStartTime*1e6)
           << "  finish: " << std::setw(6) << (readFinishTime*1e6) << "  delta: " << ((readFinishTime-readStartTime)*1e6)
           << "  gap: " << std::setw(6) << (gapTime*1e6);
    if ((gapTimeMin != 1.0) && (gapTimeMax != 0.0)) {
        outStr << " (min " << std::setw(6) << (gapTimeMin*1e6) << ", max " << (gapTimeMax*1e6) << ") ";
    }
    outStr << (readOverflow ? "OVF" : "   ");
    outStr << std::endl;
}